

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

bool __thiscall
ON_PlaneSurface::GetBBox(ON_PlaneSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  long lVar1;
  ON_3dPoint *pOVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ON_3dPoint local_b0;
  ON_3dPoint corner [4];
  
  lVar1 = 0;
  lVar3 = 0;
  do {
    pOVar2 = corner + (int)lVar1;
    lVar4 = 0;
    do {
      ON_Surface::PointAt(&local_b0,&this->super_ON_Surface,
                          *(double *)(&this->field_0x90 + lVar3 * 8),
                          *(double *)(&this->field_0xa0 + lVar4 * 8));
      pOVar2->z = local_b0.z;
      pOVar2->x = local_b0.x;
      pOVar2->y = local_b0.y;
      lVar4 = lVar4 + 1;
      pOVar2 = pOVar2 + 1;
    } while (lVar4 == 1);
    lVar1 = (int)lVar1 + lVar4;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  bVar5 = ON_GetPointListBoundingBox(3,false,4,3,&corner[0].x,boxmin,boxmax,(uint)bGrowBox);
  return bVar5;
}

Assistant:

bool ON_PlaneSurface::GetBBox( // returns true if successful
         double* boxmin,    // minimum
         double* boxmax,    // maximum
         bool bGrowBox
         ) const
{
  int i,j,k=0;
  ON_3dPoint corner[4];
  for ( i = 0; i < 2; i++ ) for ( j = 0; j < 2; j++ ) {
    corner[k++] = PointAt( m_domain[0].m_t[i], m_domain[1].m_t[j] );
  }
  return ON_GetPointListBoundingBox( 3, 0, 4, 3, 
                                     &corner[0].x, 
                                     boxmin, 
                                     boxmax, bGrowBox?true:false );
}